

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_free(void)

{
  fsnav_plugin *__ptr;
  double *__ptr_00;
  fsnav_struct *pfVar1;
  long lVar2;
  fsnav_gnss *__ptr_01;
  ulong uVar3;
  
  pfVar1 = fsnav;
  __ptr = (fsnav->core).plugins;
  if (__ptr != (fsnav_plugin *)0x0) {
    free(__ptr);
    (pfVar1->core).plugins = (fsnav_plugin *)0x0;
  }
  pfVar1 = fsnav;
  (fsnav->core).plugin_count = 0;
  if (pfVar1->cfg != (char *)0x0) {
    free(pfVar1->cfg);
    pfVar1->cfg = (char *)0x0;
    pfVar1 = fsnav;
  }
  pfVar1->cfglength = 0;
  pfVar1->cfg_settings = (char *)0x0;
  pfVar1->settings_length = 0;
  fsnav_free_imu();
  __ptr_01 = fsnav->gnss;
  pfVar1 = fsnav;
  if (__ptr_01 != (fsnav_gnss *)0x0) {
    if (fsnav->gnss_count != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        fsnav_free_gnss((fsnav_gnss *)((long)(fsnav->gnss->settings).ant_pos + lVar2 + -0x40));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x1d8;
      } while (uVar3 < fsnav->gnss_count);
      __ptr_01 = fsnav->gnss;
    }
    free(__ptr_01);
    pfVar1 = fsnav;
    fsnav->gnss = (fsnav_gnss *)0x0;
  }
  pfVar1->gnss_count = 0;
  if (pfVar1->air != (fsnav_air *)0x0) {
    pfVar1->air->cfg = (char *)0x0;
    free(fsnav->air);
  }
  fsnav_free_ref();
  pfVar1 = fsnav;
  __ptr_00 = (fsnav->sol).metrics;
  if (__ptr_00 != (double *)0x0) {
    free(__ptr_00);
    (pfVar1->sol).metrics = (double *)0x0;
  }
  return;
}

Assistant:

void fsnav_free()
{
	size_t r;

	// core
	fsnav_free_null((void**)(&(fsnav->core.plugins)));
	fsnav->core.plugin_count = 0;

	// configuration string
	fsnav_free_null((void**)(&(fsnav->cfg)));
	fsnav->cfglength = 0;
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;

	// imu
	fsnav_free_imu();

	// gnss
	if (fsnav->gnss != NULL) {
		for (r = 0; r < fsnav->gnss_count; r++)
			fsnav_free_gnss(&(fsnav->gnss[r]));
		free((void*)(fsnav->gnss));
		fsnav->gnss = NULL;
	}
	fsnav->gnss_count = 0;

	// air data
	fsnav_free_air();

	// reference data
	fsnav_free_ref();

	// solution
	fsnav_free_sol(&(fsnav->sol));
}